

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_constraint.cpp
# Opt level: O3

unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> __thiscall
duckdb::UniqueConstraint::Copy(UniqueConstraint *this)

{
  pointer pcVar1;
  LogicalIndex index;
  const_reference pvVar2;
  UniqueConstraint *this_00;
  long in_RSI;
  undefined1 local_68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined1 local_38 [16];
  
  if (*(long *)(in_RSI + 0x10) == -1) {
    this_00 = (UniqueConstraint *)operator_new(0x38);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(in_RSI + 0x18));
    UniqueConstraint(this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)local_68,*(bool *)(in_RSI + 0x30));
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
  }
  else {
    if (*(long *)(in_RSI + 0x18) == *(long *)(in_RSI + 0x20)) {
      local_48._M_allocated_capacity = (size_type)local_38;
      local_48._8_8_ = 0;
      local_38[0] = 0;
    }
    else {
      pvVar2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             *)(in_RSI + 0x18),0);
      local_48._M_allocated_capacity = (size_type)local_38;
      pcVar1 = (pvVar2->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar1,pcVar1 + pvVar2->_M_string_length);
    }
    this_00 = (UniqueConstraint *)operator_new(0x38);
    index.index = *(idx_t *)(in_RSI + 0x10);
    local_68._0_8_ = (pointer)(local_68 + 0x10);
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,local_48._M_allocated_capacity,
               (undefined1 *)(local_48._M_allocated_capacity + local_48._8_8_));
    UniqueConstraint(this_00,index,(string *)local_68,*(bool *)(in_RSI + 0x30));
    if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_);
    }
    if ((undefined1 *)local_48._M_allocated_capacity != local_38) {
      operator_delete((void *)local_48._M_allocated_capacity);
    }
  }
  (this->super_Constraint)._vptr_Constraint = (_func_int **)this_00;
  return (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
         (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)this;
}

Assistant:

unique_ptr<Constraint> UniqueConstraint::Copy() const {
	if (!HasIndex()) {
		return make_uniq<UniqueConstraint>(columns, is_primary_key);
	}

	auto result = make_uniq<UniqueConstraint>(index, columns.empty() ? string() : columns[0], is_primary_key);
	return std::move(result);
}